

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O0

bool tcu::isCubeMipmapLinearSampleResultValid
               (ConstPixelBufferAccess (*faces0) [6],ConstPixelBufferAccess (*faces1) [6],
               Sampler *sampler,FilterMode levelFilter,LookupPrecision *prec,
               CubeFaceFloatCoords *coords,Vec2 *fBounds,Vec4 *result)

{
  CubeFace CVar1;
  CubeFace CVar2;
  Vector<float,_2> local_50;
  Vector<float,_2> local_48;
  CubeFaceFloatCoords *local_40;
  CubeFaceFloatCoords *coords_local;
  LookupPrecision *prec_local;
  Sampler *pSStack_28;
  FilterMode levelFilter_local;
  Sampler *sampler_local;
  ConstPixelBufferAccess (*faces1_local) [6];
  ConstPixelBufferAccess (*faces0_local) [6];
  
  local_40 = coords;
  coords_local = (CubeFaceFloatCoords *)prec;
  prec_local._4_4_ = levelFilter;
  pSStack_28 = sampler;
  sampler_local = (Sampler *)faces1;
  faces1_local = faces0;
  if (levelFilter == LINEAR) {
    if ((sampler->seamlessCubeMap & 1U) == 0) {
      CVar1 = coords->face;
      CVar2 = coords->face;
      Vector<float,_2>::Vector(&local_48,coords->s,coords->t);
      faces0_local._7_1_ =
           isLinearMipmapLinearSampleResultValid
                     (*faces0 + CVar1,*faces1 + CVar2,sampler,prec,&local_48,0,fBounds,result);
    }
    else {
      faces0_local._7_1_ =
           isSeamplessLinearMipmapLinearSampleResultValid
                     (faces0,faces1,sampler,prec,coords,fBounds,result);
    }
  }
  else {
    CVar1 = coords->face;
    CVar2 = coords->face;
    Vector<float,_2>::Vector(&local_50,coords->s,coords->t);
    faces0_local._7_1_ =
         isNearestMipmapLinearSampleResultValid
                   (*faces0 + CVar1,*faces1 + CVar2,sampler,prec,&local_50,0,fBounds,result);
  }
  return faces0_local._7_1_;
}

Assistant:

static bool isCubeMipmapLinearSampleResultValid (const ConstPixelBufferAccess	(&faces0)[CUBEFACE_LAST],
												 const ConstPixelBufferAccess	(&faces1)[CUBEFACE_LAST],
												 const Sampler&					sampler,
												 const Sampler::FilterMode		levelFilter,
												 const LookupPrecision&			prec,
												 const CubeFaceFloatCoords&		coords,
												 const Vec2&					fBounds,
												 const Vec4&					result)
{
	if (levelFilter == Sampler::LINEAR)
	{
		if (sampler.seamlessCubeMap)
			return isSeamplessLinearMipmapLinearSampleResultValid(faces0, faces1, sampler, prec, coords, fBounds, result);
		else
			return isLinearMipmapLinearSampleResultValid(faces0[coords.face], faces1[coords.face], sampler, prec, Vec2(coords.s, coords.t), 0, fBounds, result);
	}
	else
		return isNearestMipmapLinearSampleResultValid(faces0[coords.face], faces1[coords.face], sampler, prec, Vec2(coords.s, coords.t), 0, fBounds, result);
}